

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall wabt::WastParser::ParseMemoryModuleField(WastParser *this,Module *module)

{
  ExprList *this_00;
  DataSegmentModuleField *pDVar1;
  bool bVar2;
  Result RVar3;
  reference pvVar4;
  ulong uVar5;
  pointer *__ptr;
  Enum EVar6;
  MemoryModuleField *pMVar7;
  MemoryModuleField *local_148;
  DataSegmentModuleField *local_140;
  Location local_138;
  DataSegmentModuleField *local_110;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_108;
  _Head_base<0UL,_wabt::DataSegmentModuleField_*,_false> local_100;
  _Head_base<0UL,_wabt::MemoryModuleField_*,_false> local_f8;
  Expr *local_f0;
  _Head_base<0UL,_wabt::Expr_*,_false> local_e8;
  _Head_base<0UL,_wabt::ImportModuleField_*,_false> local_e0;
  string name;
  Location loc;
  ModuleFieldList export_fields;
  Const local_78;
  
  RVar3 = Expect(this,Lpar);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  GetLocation(&loc,this);
  RVar3 = Expect(this,Memory);
  if (RVar3.enum_ == Error) {
    return (Result)Error;
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&name);
  export_fields.first_ = (ModuleField *)0x0;
  export_fields.last_ = (ModuleField *)0x0;
  export_fields.size_ = 0;
  RVar3 = ParseInlineExports(this,&export_fields,Memory);
  EVar6 = Error;
  if (RVar3.enum_ == Error) goto LAB_0017a050;
  bVar2 = PeekMatchLpar(this,Import);
  if (bVar2) {
    CheckImportOrdering(this,module);
    MakeUnique<wabt::MemoryImport,std::__cxx11::string&>((wabt *)&local_138,&name);
    RVar3 = ParseInlineImport(this,(Import *)local_138.filename.data_);
    pMVar7 = (MemoryModuleField *)local_138.filename.data_;
    if (((RVar3.enum_ != Error) &&
        (RVar3 = ParseLimitsIndex(this,(Limits *)
                                       &(((Memory *)((long)local_138.filename.data_ + 0x40))->
                                        page_limits).has_max),
        pMVar7 = (MemoryModuleField *)local_138.filename.data_, RVar3.enum_ != Error)) &&
       (RVar3 = ParseLimits(this,(Limits *)
                                 &(((Memory *)((long)local_138.filename.data_ + 0x40))->page_limits)
                                  .has_max), pMVar7 = (MemoryModuleField *)local_138.filename.data_,
       RVar3.enum_ != Error)) {
      GetLocation(&local_78.loc,this);
      MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::MemoryImport,std::default_delete<wabt::MemoryImport>>,wabt::Location>
                ((wabt *)&local_148,
                 (unique_ptr<wabt::MemoryImport,_std::default_delete<wabt::MemoryImport>_> *)
                 &local_138,&local_78.loc);
      local_e0._M_head_impl = (ImportModuleField *)local_148;
      local_148 = (MemoryModuleField *)0x0;
      Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                  *)&local_e0);
      if ((MemoryModuleField *)local_e0._M_head_impl != (MemoryModuleField *)0x0) {
        (*(((ModuleFieldMixin<(wabt::ModuleFieldType)7> *)
           &(local_e0._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)2>)->
          super_ModuleField)._vptr_ModuleField[1])();
      }
      local_e0._M_head_impl = (ImportModuleField *)0x0;
      pMVar7 = (MemoryModuleField *)local_138.filename.data_;
      if (local_148 != (MemoryModuleField *)0x0) {
        (*(local_148->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
          _vptr_ModuleField[1])();
        pMVar7 = (MemoryModuleField *)local_138.filename.data_;
      }
      goto LAB_0017a00d;
    }
  }
  else {
    MakeUnique<wabt::MemoryModuleField,wabt::Location&,std::__cxx11::string&>
              ((wabt *)&local_148,&loc,&name);
    RVar3 = ParseLimitsIndex(this,&(local_148->memory).page_limits);
    pMVar7 = local_148;
    if (RVar3.enum_ != Error) {
      bVar2 = MatchLpar(this,Data);
      if (bVar2) {
        MakeUnique<wabt::DataSegmentModuleField,wabt::Location&>((wabt *)&local_140,&loc);
        pDVar1 = local_140;
        local_138.field_1.field_0.line = 0;
        local_138.field_1._4_8_ = 0;
        local_138.filename.data_ = (char *)0x0;
        local_138.filename.size_._0_4_ = 0;
        local_138.filename.size_._4_4_ = 0;
        Var::Var((Var *)&local_78,
                 (Index)((ulong)((long)(module->memories).
                                       super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(module->memories).
                                      super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3),&local_138);
        Var::operator=(&(pDVar1->data_segment).memory_var,(Var *)&local_78);
        Var::~Var((Var *)&local_78);
        local_110 = pDVar1;
        this_00 = &(pDVar1->data_segment).offset;
        local_138.field_1.field_0.line = 0;
        local_138.field_1._4_8_ = 0;
        local_138.filename.data_ = (char *)0x0;
        local_138.filename.size_._0_4_ = 0;
        local_138.filename.size_._4_4_ = 0;
        Const::I32(&local_78,0,&local_138);
        MakeUnique<wabt::ConstExpr,wabt::Const>((wabt *)&local_f0,&local_78);
        local_e8._M_head_impl = local_f0;
        local_f0 = (Expr *)0x0;
        intrusive_list<wabt::Expr>::push_back
                  (this_00,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_e8);
        if (local_e8._M_head_impl != (Expr *)0x0) {
          (*(local_e8._M_head_impl)->_vptr_Expr[1])();
        }
        local_e8._M_head_impl = (Expr *)0x0;
        if (local_f0 != (Expr *)0x0) {
          (*local_f0->_vptr_Expr[1])();
        }
        pvVar4 = intrusive_list<wabt::Expr>::back(this_00);
        pDVar1 = local_110;
        (pvVar4->loc).filename.data_ = loc.filename.data_;
        (pvVar4->loc).filename.size_ = loc.filename.size_;
        (pvVar4->loc).field_1.field_1.offset = (size_t)loc.field_1.field_1.offset;
        *(undefined8 *)((long)&(pvVar4->loc).field_1 + 8) = loc.field_1._8_8_;
        ParseTextListOpt(this,&(local_110->data_segment).data);
        RVar3 = Expect(this,Rpar);
        if (RVar3.enum_ != Error) {
          uVar5 = (ulong)((*(int *)&(pDVar1->data_segment).data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(pDVar1->data_segment).data.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start) + 0xffffU >> 0x10);
          (local_148->memory).page_limits.initial = uVar5;
          (local_148->memory).page_limits.max = uVar5;
          (local_148->memory).page_limits.has_max = true;
          local_f8._M_head_impl = local_148;
          local_148 = (MemoryModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_f8);
          if (local_f8._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_f8._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_f8._M_head_impl = (MemoryModuleField *)0x0;
          local_100._M_head_impl = local_140;
          local_140 = (DataSegmentModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                                      *)&local_100);
          if (local_100._M_head_impl != (DataSegmentModuleField *)0x0) {
            (*((local_100._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_100._M_head_impl = (DataSegmentModuleField *)0x0;
        }
        if (local_140 != (DataSegmentModuleField *)0x0) {
          (*(local_140->super_ModuleFieldMixin<(wabt::ModuleFieldType)8>).super_ModuleField.
            _vptr_ModuleField[1])();
        }
        pMVar7 = local_148;
        if (RVar3.enum_ != Error) {
LAB_0017a00d:
          if (pMVar7 != (MemoryModuleField *)0x0) {
            (*(pMVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField.
              _vptr_ModuleField[1])();
          }
          anon_unknown_1::AppendInlineExportFields
                    (module,&export_fields,
                     (int)((ulong)((long)(module->memories).
                                         super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(module->memories).
                                        super__Vector_base<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
          RVar3 = Expect(this,Rpar);
          EVar6 = (Enum)(RVar3.enum_ == Error);
          goto LAB_0017a050;
        }
      }
      else {
        RVar3 = ParseLimits(this,&(local_148->memory).page_limits);
        pMVar7 = local_148;
        if (RVar3.enum_ != Error) {
          local_108._M_head_impl = local_148;
          local_148 = (MemoryModuleField *)0x0;
          Module::AppendField(module,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                                      *)&local_108);
          if (local_108._M_head_impl != (MemoryModuleField *)0x0) {
            (*((local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).
              super_ModuleField._vptr_ModuleField[1])();
          }
          local_108._M_head_impl = (MemoryModuleField *)0x0;
          pMVar7 = local_148;
          goto LAB_0017a00d;
        }
      }
    }
  }
  if (pMVar7 != (MemoryModuleField *)0x0) {
    (*(pMVar7->super_ModuleFieldMixin<(wabt::ModuleFieldType)7>).super_ModuleField._vptr_ModuleField
      [1])();
  }
LAB_0017a050:
  intrusive_list<wabt::ModuleField>::clear(&export_fields);
  std::__cxx11::string::_M_dispose();
  return (Result)EVar6;
}

Assistant:

Result WastParser::ParseMemoryModuleField(Module* module) {
  WABT_TRACE(ParseMemoryModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Memory);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Memory));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<MemoryImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->memory.page_limits));
    CHECK_RESULT(ParseLimits(&import->memory.page_limits));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<MemoryModuleField>(loc, name);
    CHECK_RESULT(ParseLimitsIndex(&field->memory.page_limits));
    if (MatchLpar(TokenType::Data)) {
      auto data_segment_field = MakeUnique<DataSegmentModuleField>(loc);
      DataSegment& data_segment = data_segment_field->data_segment;
      data_segment.memory_var = Var(module->memories.size());
      data_segment.offset.push_back(MakeUnique<ConstExpr>(Const::I32(0)));
      data_segment.offset.back().loc = loc;
      ParseTextListOpt(&data_segment.data);
      EXPECT(Rpar);

      uint32_t byte_size = WABT_ALIGN_UP_TO_PAGE(data_segment.data.size());
      uint32_t page_size = WABT_BYTES_TO_PAGES(byte_size);
      field->memory.page_limits.initial = page_size;
      field->memory.page_limits.max = page_size;
      field->memory.page_limits.has_max = true;

      module->AppendField(std::move(field));
      module->AppendField(std::move(data_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&field->memory.page_limits));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->memories.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}